

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTestDriver.cpp
# Opt level: O2

bool __thiscall
xs::TestDriver::writeMessage(TestDriver *this,ByteBuffer *messageBuffer,Message *message)

{
  int count;
  int iVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (uchar *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*message->_vptr_Message[2])(message);
  iVar1 = messageBuffer->m_size - messageBuffer->m_numElements;
  count = (int)local_38._M_impl.super__Vector_impl_data._M_finish -
          (int)local_38._M_impl.super__Vector_impl_data._M_start;
  if (count <= iVar1) {
    de::RingBuffer<unsigned_char>::pushFront
              (messageBuffer,local_38._M_impl.super__Vector_impl_data._M_start,count);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return count <= iVar1;
}

Assistant:

bool TestDriver::writeMessage (ByteBuffer& messageBuffer, const Message& message)
{
	vector<deUint8> buf;
	message.write(buf);

	if (messageBuffer.getNumFree() < (int)buf.size())
		return false;

	messageBuffer.pushFront(&buf[0], (int)buf.size());
	return true;
}